

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  StkId pTVar4;
  lu_mem *osize;
  ulong uVar5;
  lua_State *L1;
  bool bVar6;
  
  L1 = (lua_State *)*p;
  if (L1 != (lua_State *)0x0) {
    bVar1 = L->l_G->currentwhite;
    do {
      bVar6 = count == 0;
      count = count - 1;
      if (bVar6) {
        return &((lua_State *)p)->next;
      }
      if ((byte)((L1->marked ^ 3) & (bVar1 ^ 3)) != 0) {
        L1->marked = L1->marked & 0xf8 | bVar1 & 3;
        p = &L1->next;
        goto switchD_001148c5_caseD_a;
      }
      ((lua_State *)p)->next = L1->next;
      switch(L1->tt) {
      case '\x04':
        luaS_remove(L,(TString *)L1);
        pTVar4 = (StkId)(ulong)*(byte *)((long)&L1->nci + 1);
        goto LAB_001148f3;
      case '\x05':
        luaH_free(L,(Table *)L1);
        break;
      case '\x06':
        bVar2 = (byte)L1->nci;
        uVar3 = (ulong)bVar2;
        if (bVar2 != 0) {
          uVar5 = 0;
          do {
            if ((&L1->ci)[uVar5] != (CallInfo *)0x0) {
              luaC_upvdeccount(L,(UpVal *)(&L1->ci)[uVar5]);
            }
            uVar5 = uVar5 + 1;
            uVar3 = (ulong)(byte)L1->nci;
          } while (uVar5 < uVar3);
        }
        osize = (lu_mem *)(uVar3 * 8 + 0x20);
        goto LAB_00114944;
      case '\a':
        osize = &L1->l_G->GCestimate;
        goto LAB_00114944;
      case '\b':
        luaE_freethread(L,L1);
        break;
      case '\t':
        luaF_freeproto(L,(Proto *)L1);
        break;
      case '\n':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
      case '\x10':
      case '\x11':
      case '\x12':
      case '\x13':
        break;
      case '\x14':
        pTVar4 = L1->top;
LAB_001148f3:
        osize = (lu_mem *)((long)&pTVar4[1].tt_ + 1);
LAB_00114944:
        luaM_realloc_(L,L1,(size_t)osize,0);
        break;
      default:
        if (L1->tt == '&') {
          osize = (lu_mem *)((ulong)(byte)L1->nci * 0x10 + 0x20);
          goto LAB_00114944;
        }
      }
switchD_001148c5_caseD_a:
      L1 = (lua_State *)((lua_State *)p)->next;
    } while (L1 != (lua_State *)0x0);
  }
  return (GCObject **)0x0;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, lu_mem count) {
  global_State *g = G(L);
  int ow = otherwhite(g);
  int white = luaC_white(g);  /* current white */
  while (*p != NULL && count-- > 0) {
    GCObject *curr = *p;
    int marked = curr->marked;
    if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* change mark to 'white' */
      curr->marked = cast_byte((marked & maskcolors) | white);
      p = &curr->next;  /* go to next element */
    }
  }
  return (*p == NULL) ? NULL : p;
}